

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastSR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  SerialArena *this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  int iVar6;
  Rep *pRVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  Nonnull<const_char_*> failure_msg;
  string *s;
  char *pcVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  uint uVar11;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  unsigned_long v2;
  ushort *ptr_00;
  ulong uVar12;
  uint *puVar13;
  long in_FS_OFFSET;
  pair<const_char_*,_int> pVar14;
  LogMessageFatal local_40;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar2 = *(ushort *)ptr;
  if (((long *)this_00[2].data == (long *)0x0) ||
     (data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80,
     *(long *)(in_FS_OFFSET + -0x78) != *(long *)this_00[2].data)) {
LAB_0043e02e:
    do {
      ptr_00 = (ushort *)((long)ptr + 2);
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_00;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0043e136;
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      iVar6 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,pVVar8->_M_string_length);
      if (iVar6 == 0) {
        ReportFastUtf8Error((int)(char)uVar2 + (uint)uVar2 >> 1,table);
      }
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (ctx->super_EpsCopyInputStream).limit_end_;
      if ((ulong)data.field_0 <= ptr) goto LAB_0043e122;
      uVar3 = *(ushort *)ptr;
    } while (uVar3 == uVar2);
  }
  else {
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar11 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar7 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar11 = pRVar7->allocated_size;
    }
    if (uVar11 != *(uint *)(this_00 + 1)) goto LAB_0043e02e;
    aVar10._0_4_ = (int)(char)uVar2 + (uint)uVar2 >> 1;
    aVar10.data._4_4_ = 0;
    data.field_0 = aVar10;
    do {
      bVar1 = (byte)*(ushort *)((long)ptr + 2);
      ptr_00 = (ushort *)(ulong)bVar1;
      uVar11 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar14 = ReadSizeFallback((char *)((long)ptr + 2),(uint)bVar1);
        ctx_00 = pVar14._8_8_;
        if ((ushort *)pVar14.first == (ushort *)0x0) {
LAB_0043e136:
          pcVar9 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
          return pcVar9;
        }
        uVar11 = pVar14.second;
        ptr_00 = (ushort *)pVar14.first;
      }
      else {
        ptr_00 = (ushort *)((long)ptr + 3);
      }
      _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var4 == 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        uVar12 = _Var4 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar12;
        pSVar5 = (this->string_block_)._M_b._M_p;
        v2 = (ulong)pSVar5->allocated_size_ - 0x10;
        if (v2 < uVar12) {
          failure_msg = absl::lts_20250127::log_internal::
                        MakeCheckOpString<unsigned_long,unsigned_long>
                                  (uVar12,v2,"offset <= effective_size()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                     ,0xa2,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)&pSVar5[-1].next_ + _Var4);
      }
      *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
      *(undefined8 *)((long)data.field_0 + 8) = 0;
      *(undefined1 *)((long)data.field_0 + 0x10) = 0;
      RepeatedPtrFieldBase::AddAllocatedForParse
                ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
      ptr = EpsCopyInputStream::ReadString
                      (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar11,(string *)data.field_0);
      ctx_00 = extraout_RDX;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0043e136;
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      iVar6 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,pVVar8->_M_string_length);
      if (iVar6 == 0) {
        ReportFastUtf8Error(aVar10._0_4_,table);
      }
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (ctx->super_EpsCopyInputStream).limit_end_;
      if ((ulong)data.field_0 <= ptr) goto LAB_0043e122;
      uVar3 = *(ushort *)ptr;
    } while (uVar3 == uVar2);
  }
  if (ptr < (ulong)data.field_0) {
    uVar11 = (uint)table->fast_idx_mask & (uint)uVar3;
    if ((uVar11 & 7) == 0) {
      uVar12 = (ulong)(uVar11 & 0xfffffff8);
      pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar12))
                                 (msg,ptr,ctx,
                                  (ulong)(uint)uVar3 ^
                                  *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2),table,hasbits);
      return pcVar9;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar2 = table->has_bits_offset;
joined_r0x0043e132:
  if ((ulong)uVar2 != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar2);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_0043e122:
  uVar2 = table->has_bits_offset;
  goto joined_r0x0043e132;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint16_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}